

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_decode_logic.c
# Opt level: O3

uint16_t calc_indirectX_address(cpu_registers *registers)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  
  uVar1 = read_RAM(registers->PC);
  bVar3 = uVar1 + registers->X;
  uVar1 = read_RAM((ushort)bVar3);
  uVar2 = read_RAM((ushort)(byte)(bVar3 + 1));
  return CONCAT11(uVar2,uVar1);
}

Assistant:

uint16_t calc_indirectX_address(cpu_registers* registers) {
    uint8_t low_byte_address = calc_zeropageX_address(registers);
    uint8_t high_byte_address = (low_byte_address + 1) & BYTE_MASK;

    uint8_t low_byte = read_RAM(low_byte_address);
    uint8_t high_byte = read_RAM(high_byte_address);
    uint16_t indirectX_address = (high_byte << 8) | low_byte;
    return indirectX_address;
}